

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O3

void __thiscall
mir::inst::MirFunction::MirFunction
          (MirFunction *this,string *_name,shared_ptr<mir::types::FunctionTy> *_type)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ed478;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar2 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar2,pcVar2 + _name->_M_string_length);
  (this->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_type->super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (_type->super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  p_Var1 = &(this->variables)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->variables)._M_t._M_impl = 0;
  *(undefined8 *)&(this->variables)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->basic_blks)._M_t._M_impl = 0;
  *(undefined8 *)&(this->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

MirFunction(std::string _name, std::shared_ptr<types::FunctionTy> _type)
      : name(_name), type(_type), basic_blks(), variables() {}